

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSMLoader.cpp
# Opt level: O0

bool __thiscall
Assimp::CSMImporter::CanRead(CSMImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  long lVar2;
  char *local_68;
  char *tokens [1];
  undefined1 local_50 [8];
  string extension;
  bool checkSig_local;
  IOSystem *pIOHandler_local;
  string *pFile_local;
  CSMImporter *this_local;
  
  extension.field_2._M_local_buf[0xf] = checkSig;
  BaseImporter::GetExtension((string *)local_50,pFile);
  bVar1 = std::operator==((string *)local_50,"csm");
  if (bVar1) {
    this_local._7_1_ = true;
    goto LAB_0064f077;
  }
  if ((extension.field_2._M_local_buf[0xf] & 1U) == 0) {
    lVar2 = std::__cxx11::string::length();
    if (lVar2 == 0) goto LAB_0064f01c;
  }
  else {
LAB_0064f01c:
    if (pIOHandler != (IOSystem *)0x0) {
      local_68 = "$Filename";
      this_local._7_1_ =
           BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,&local_68,1,200,false,false);
      goto LAB_0064f077;
    }
  }
  this_local._7_1_ = false;
LAB_0064f077:
  tokens[0]._0_4_ = 1;
  std::__cxx11::string::~string((string *)local_50);
  return this_local._7_1_;
}

Assistant:

bool CSMImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    // check file extension
    const std::string extension = GetExtension(pFile);

    if( extension == "csm")
        return true;

    if ((checkSig || !extension.length()) && pIOHandler) {
        const char* tokens[] = {"$Filename"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,1);
    }
    return false;
}